

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.h
# Opt level: O3

void helper::replace<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchIn,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchFor,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *replaceWith)

{
  ulong uVar1;
  
  uVar1 = 0;
  do {
    uVar1 = std::__cxx11::string::find((char *)searchIn,(ulong)(searchFor->_M_dataplus)._M_p,uVar1);
    if (uVar1 == 0xffffffffffffffff) {
      return;
    }
    std::__cxx11::string::replace
              ((ulong)searchIn,uVar1,(char *)searchFor->_M_string_length,
               (ulong)(replaceWith->_M_dataplus)._M_p);
    uVar1 = uVar1 + replaceWith->_M_string_length;
  } while (uVar1 != 0xffffffffffffffff);
  return;
}

Assistant:

void replace( T &searchIn, const T &searchFor, const T &replaceWith )
	{
		size_t pos = 0;
		while( pos != T::npos )
		{
			pos = searchIn.find( searchFor, pos );
			if( pos != T::npos )
			{
				searchIn.replace( pos, searchFor.size(), replaceWith );
				pos += replaceWith.size();
			}
		}
	}